

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O3

Node * mainposition(Table *t,TValue *key)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  
  switch(key->tt) {
  case 1:
    uVar2 = ~(-1 << (t->lsizenode & 0x1f)) & (key->value).b;
    break;
  default:
    uVar3 = (ulong)(uint)(key->value).b % (ulong)(~(-1 << (t->lsizenode & 0x1f)) | 1);
    goto LAB_00114ec6;
  case 3:
    dVar1 = (key->value).n;
    if ((dVar1 == 0.0) && (!NAN(dVar1))) {
      return t->node;
    }
    uVar3 = (ulong)(uint)((int)((ulong)dVar1 >> 0x20) + SUB84(dVar1,0)) %
            (ulong)(~(-1 << (t->lsizenode & 0x1f)) | 1);
    goto LAB_00114ec6;
  case 4:
    uVar2 = ~(-1 << (t->lsizenode & 0x1f)) & *(uint *)((long)(key->value).gc + 0xc);
  }
  uVar3 = (ulong)uVar2;
LAB_00114ec6:
  return t->node + uVar3;
}

Assistant:

static Node *mainposition (const Table *t, const TValue *key) {
  switch (ttype(key)) {
    case LUA_TNUMBER:
      return hashnum(t, nvalue(key));
    case LUA_TSTRING:
      return hashstr(t, rawtsvalue(key));
    case LUA_TBOOLEAN:
      return hashboolean(t, bvalue(key));
    case LUA_TLIGHTUSERDATA:
      return hashpointer(t, pvalue(key));
    default:
      return hashpointer(t, gcvalue(key));
  }
}